

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall edition_unittest::TestFieldOrderings::ByteSizeLong(TestFieldOrderings *this)

{
  uint uVar1;
  uint32_t *puVar2;
  size_t sVar3;
  int64_t value;
  string_view sVar4;
  WireFormatLite *local_70;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestFieldOrderings *this_;
  TestFieldOrderings *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  sStack_58 = (long)(int)((uint)((uVar1 & 8) != 0) * 6) + sStack_58;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar4 = _internal_my_string(this);
      local_70 = (WireFormatLite *)sVar4._M_len;
      sVar4._M_len = (size_t)sVar4._M_str;
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(local_70,sVar4);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestFieldOrderings_NestedMessage>
                        ((this->field_0)._impl_.optional_nested_message_);
      sStack_58 = sVar3 + 2 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      value = _internal_my_int(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(value);
      sStack_58 = sVar3 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestFieldOrderings::ByteSizeLong() const {
  const TestFieldOrderings& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestFieldOrderings)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000008u & cached_has_bits) * 6;
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string my_string = 11;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_my_string());
    }
    // .edition_unittest.TestFieldOrderings.NestedMessage optional_nested_message = 200;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // int64 my_int = 1;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_my_int());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}